

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> * __thiscall
bssl::InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::operator=
          (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this,
          InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *other)

{
  vector<int,_std::allocator<int>_> *__first;
  vector<int,_std::allocator<int>_> *__last;
  vector<int,_std::allocator<int>_> *__result;
  size_t sVar1;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *other_local;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this_local;
  
  clear(this);
  __first = begin(other);
  __last = end(other);
  __result = data(this);
  std::
  uninitialized_move<std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*>
            (__first,__last,__result);
  sVar1 = size(other);
  this->size_ = (PackedSize<4UL>)sVar1;
  return this;
}

Assistant:

InplaceVector &operator=(InplaceVector &&other) {
    clear();
    std::uninitialized_move(other.begin(), other.end(), data());
    size_ = other.size();
    return *this;
  }